

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

void __thiscall
wallet::coinselector_tests::wallet_coinsresult_test::test_method(wallet_coinsresult_test *this)

{
  COutPoint *b;
  long lVar1;
  pointer pCVar2;
  int iVar3;
  COutPoint *a;
  iterator in_R8;
  iterator in_R9;
  long lVar4;
  __node_base _Var5;
  long lVar6;
  long lVar7;
  ArgsManager *pAVar8;
  ArgsManager *pAVar9;
  long in_FS_OFFSET;
  bool bVar10;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  check_type cVar12;
  undefined8 in_stack_fffffffffffffe58;
  ArgsManager *pAVar11;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> dummyWallet;
  assertion_result local_130;
  unique_ptr<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_> local_118;
  unique_ptr<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_> local_110;
  char *local_108;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> local_100;
  vector<wallet::COutput,_std::allocator<wallet::COutput>_> local_f8;
  vector<wallet::COutput,_std::allocator<wallet::COutput>_> local_e0;
  unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
  outs_to_remove;
  CoinsResult available_coins;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  available_coins.total_amount = 0;
  available_coins.total_effective_amount.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = 0;
  available_coins.total_effective_amount.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = true;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&outs_to_remove,"dummy",(allocator<char> *)&local_e0);
  NewWallet((NodeContext *)&dummyWallet,(string *)&(this->super_BasicTestingSetup).m_node);
  std::__cxx11::string::~string((string *)&outs_to_remove);
  iVar3 = 10;
  while (bVar10 = iVar3 != 0, iVar3 = iVar3 + -1, bVar10) {
    outs_to_remove._M_h.
    super__Hashtable_base<COutPoint,_COutPoint,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    .
    super__Hash_code_base<COutPoint,_COutPoint,_std::__detail::_Identity,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
    .super__Hashtable_ebo_helper<1,_SaltedOutpointHasher,_false>._M_tp.k0 = 100000000;
    in_R8 = (iterator)0x90;
    in_R9 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             dummyWallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&outs_to_remove
             ,(CFeeRate)0x0,0x90,false,0,false,(int)in_stack_fffffffffffffe58);
  }
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr(&dummyWallet)
  ;
  std::
  _Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_Hashtable(&outs_to_remove._M_h);
  CoinsResult::All(&local_e0,&available_coins);
  for (lVar6 = 0x20; lVar6 != 0x160; lVar6 = lVar6 + 0xa0) {
    std::
    _Hashtable<COutPoint,COutPoint,std::allocator<COutPoint>,std::__detail::_Identity,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_M_emplace<COutPoint_const&>
              ((_Hashtable<COutPoint,COutPoint,std::allocator<COutPoint>,std::__detail::_Identity,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&outs_to_remove,
               (long)(&((local_e0.
                         super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>.
                         _M_impl.super__Vector_impl_data._M_start)->outpoint).hash + -1) + lVar6);
  }
  CoinsResult::Erase(&available_coins,&outs_to_remove);
  CoinsResult::All(&local_f8,&available_coins);
  _Var5 = outs_to_remove._M_h._M_before_begin;
  do {
    pCVar2 = local_f8.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (_Var5._M_nxt == (_Hash_node_base *)0x0) {
      local_180 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_178 = "";
      local_190 = &boost::unit_test::basic_cstring<char_const>::null;
      local_188 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_00.m_end = in_R9;
      msg_00.m_begin = in_R8;
      file_00.m_end = (iterator)0x633;
      file_00.m_begin = (iterator)&local_180;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_190,
                 msg_00);
      dummyWallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
      ._M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
      super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl =
           (__uniq_ptr_data<wallet::CWallet,_std::default_delete<wallet::CWallet>,_true,_true>)
           &PTR__lazy_ostream_01139f30;
      local_1a0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_198 = "";
      local_130._0_8_ = CoinsResult::Size(&available_coins);
      local_160 = (char *)CONCAT44(local_160._4_4_,8);
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                (&dummyWallet,&local_1a0,0x633,1,2,
                 (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_> *)&local_130,
                 "available_coins.Size()",&local_160,"8");
      std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector(&local_f8);
      std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector(&local_e0);
      std::
      _Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&outs_to_remove._M_h);
      std::
      _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                   *)&available_coins);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
    b = (COutPoint *)(_Var5._M_nxt + 1);
    lVar7 = (long)local_f8.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_f8.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    lVar6 = 0;
    pAVar9 = (ArgsManager *)
             local_f8.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (lVar4 = lVar7 / 0xa0 >> 2;
        a = (COutPoint *)
            ((long)&(((Mutex *)&pCVar2->effective_value)->super_mutex).super___mutex_base._M_mutex +
            lVar6 + 0x20), 0 < lVar4; lVar4 = lVar4 + -1) {
      bVar10 = ::operator==(a,b);
      if (bVar10) {
        pAVar9 = (ArgsManager *)
                 ((((Mutex *)&pCVar2->effective_value)->super_mutex).super___mutex_base._M_mutex.
                  __size + lVar6);
        goto LAB_00629ce6;
      }
      bVar10 = ::operator==((COutPoint *)
                            ((long)&((CRollingBloomFilter *)((long)pCVar2 + 0xc0))->
                                    nEntriesPerGeneration + lVar6),b);
      if (bVar10) {
        pAVar9 = (ArgsManager *)
                 ((((CBanDB *)((long)pCVar2 + 0x68))->m_banlist_json).super_path._M_pathname.field_2
                  ._M_local_buf + lVar6);
        goto LAB_00629ce6;
      }
      bVar10 = ::operator==((COutPoint *)
                            ((long)&(((BanMan *)((long)pCVar2 + 0xf0))->m_ban_db).m_banlist_dat.
                                    super_path._M_pathname._M_string_length + lVar6),b);
      if (bVar10) {
        pAVar9 = (ArgsManager *)
                 ((long)&(((BanMan *)((long)pCVar2 + 0xf0))->m_banned)._M_t._M_impl.
                         super__Rb_tree_header._M_node_count + lVar6);
        goto LAB_00629ce6;
      }
      bVar10 = ::operator==((COutPoint *)
                            ((long)&(((BanMan *)((long)pCVar2 + 0x1e0))->m_banned_mutex).super_mutex
                                    .super___mutex_base._M_mutex + lVar6 + 0x20),b);
      if (bVar10) {
        pAVar9 = (ArgsManager *)
                 ((((BanMan *)((long)pCVar2 + 0x1e0))->m_banned_mutex).super_mutex.
                  super___mutex_base._M_mutex.__size + lVar6);
        goto LAB_00629ce6;
      }
      lVar6 = lVar6 + 0x280;
    }
    lVar4 = (lVar7 - lVar6) / 0xa0;
    pAVar8 = (ArgsManager *)
             ((((Mutex *)&pCVar2->effective_value)->super_mutex).super___mutex_base._M_mutex.__size
             + lVar6);
    pAVar11 = pAVar9;
    if (lVar4 == 1) {
LAB_00629cd3:
      bVar10 = ::operator==((COutPoint *)
                            &(pAVar8->cs_args).super_recursive_mutex.super___recursive_mutex_base.
                             _M_mutex.__data.__list.__next,b);
      pAVar9 = pAVar8;
      if (!bVar10) {
        pAVar9 = pAVar11;
      }
    }
    else if (lVar4 == 3) {
      bVar10 = ::operator==(a,b);
      pAVar9 = pAVar8;
      if (!bVar10) {
        pAVar8 = (ArgsManager *)
                 ((((CBanDB *)((long)pCVar2 + 0x68))->m_banlist_json).super_path._M_pathname.field_2
                  ._M_local_buf + lVar6);
        goto LAB_00629cbc;
      }
    }
    else if (lVar4 == 2) {
LAB_00629cbc:
      bVar10 = ::operator==((COutPoint *)
                            &(pAVar8->cs_args).super_recursive_mutex.super___recursive_mutex_base.
                             _M_mutex.__data.__list.__next,b);
      pAVar9 = pAVar8;
      if (!bVar10) {
        pAVar8 = (ArgsManager *)
                 &(pAVar8->m_settings).rw_settings._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        goto LAB_00629cd3;
      }
    }
LAB_00629ce6:
    local_108 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_100._M_t.super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
    ._M_t.super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
    super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl =
         (__uniq_ptr_data<ChainstateManager,_std::default_delete<ChainstateManager>,_true,_true>)
         ((long)
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
         + 0x72);
    local_118._M_t.
    super___uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>._M_t.
    super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>.
    super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl =
         (__uniq_ptr_data<const_NetGroupManager,_std::default_delete<const_NetGroupManager>,_true,_true>
          )&boost::unit_test::basic_cstring<char_const>::null;
    local_110._M_t.
    super___uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>._M_t.
    super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
    super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
         (__uniq_ptr_data<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>,_true,_true>
          )&boost::unit_test::basic_cstring<char_const>::null;
    _cVar12 = 0x629d3c;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x630;
    file.m_begin = (iterator)&local_108;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_118,msg);
    local_130.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         (pAVar9 ==
         (ArgsManager *)
         local_f8.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>._M_impl.
         super__Vector_impl_data._M_finish);
    local_130.m_message.px = (element_type *)0x0;
    local_130.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_160 = "it == updated_coins.end()";
    local_158 = "";
    dummyWallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
    _M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
    super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl =
         (__uniq_ptr_data<wallet::CWallet,_std::default_delete<wallet::CWallet>,_true,_true>)
         &PTR__lazy_ostream_0113a070;
    local_170 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_168 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_130,(lazy_ostream *)&dummyWallet,1,0,WARN,_cVar12,(size_t)&local_170,0x630);
    boost::detail::shared_count::~shared_count((shared_count *)&local_130.m_message.pn);
    _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt;
  } while( true );
}

Assistant:

BOOST_FIXTURE_TEST_CASE(wallet_coinsresult_test, BasicTestingSetup)
{
    // Test case to verify CoinsResult object sanity.
    CoinsResult available_coins;
    {
        std::unique_ptr<CWallet> dummyWallet = NewWallet(m_node, /*wallet_name=*/"dummy");

        // Add some coins to 'available_coins'
        for (int i=0; i<10; i++) {
            add_coin(available_coins, *dummyWallet, 1 * COIN);
        }
    }

    {
        // First test case, check that 'CoinsResult::Erase' function works as expected.
        // By trying to erase two elements from the 'available_coins' object.
        std::unordered_set<COutPoint, SaltedOutpointHasher> outs_to_remove;
        const auto& coins = available_coins.All();
        for (int i = 0; i < 2; i++) {
            outs_to_remove.emplace(coins[i].outpoint);
        }
        available_coins.Erase(outs_to_remove);

        // Check that the elements were actually removed.
        const auto& updated_coins = available_coins.All();
        for (const auto& out: outs_to_remove) {
            auto it = std::find_if(updated_coins.begin(), updated_coins.end(), [&out](const COutput &coin) {
                return coin.outpoint == out;
            });
            BOOST_CHECK(it == updated_coins.end());
        }
        // And verify that no extra element were removed
        BOOST_CHECK_EQUAL(available_coins.Size(), 8);
    }
}